

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

bool __thiscall SkipList::containsElement(SkipList *this,int value)

{
  reference ppEVar1;
  int local_24;
  value_type pEStack_20;
  int i;
  Element *p;
  int value_local;
  SkipList *this_local;
  
  pEStack_20 = &this->head;
  for (local_24 = this->height; -1 < local_24; local_24 = local_24 + -1) {
    while (ppEVar1 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::
                     operator[](&pEStack_20->next,(long)local_24), (*ppEVar1)->value < value) {
      ppEVar1 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          (&pEStack_20->next,(long)local_24);
      pEStack_20 = *ppEVar1;
    }
  }
  ppEVar1 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                      (&pEStack_20->next,0);
  return (*ppEVar1)->value == value;
}

Assistant:

bool SkipList::containsElement(int value) {
    Element *p = &head;
    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
    }

    // now either p == &head and x <= p->next[0]->key
    // or p != &head and p->key < x <= p->next[0]->key
    p = p->next[0];
    return p->value == value;  // x is at position p in list or in list
}